

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_c_gapc.c
# Opt level: O0

void func_exc_unpol(xc_func_type *p,size_t ip,double *rho,double *sigma,double *lapl,double *tau,
                   xc_mgga_out_params *out)

{
  double *pdVar1;
  bool bVar2;
  double *in_RCX;
  long lVar3;
  double *in_RDX;
  long in_RSI;
  long *in_RDI;
  double *in_R9;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  long *in_stack_00000008;
  hyb_mgga_xc_gas22_params *params;
  double tzk0;
  double t317;
  double t316;
  double t314;
  double t313;
  double t312;
  double t310;
  double t309;
  double t308;
  double t307;
  double t305;
  double t303;
  double t302;
  double t301;
  double t300;
  double t299;
  double t297;
  double t296;
  double t295;
  double t294;
  double t293;
  double t292;
  double t291;
  double t289;
  double t287;
  double t286;
  double t285;
  double t284;
  double t282;
  double t280;
  double t275;
  double t274;
  double t271;
  double t266;
  double t264;
  double t261;
  double t258;
  double t257;
  double t254;
  double t252;
  double t249;
  double t246;
  double t245;
  double t243;
  double t241;
  double t239;
  double t234;
  double t233;
  double t232;
  double t231;
  double t230;
  double t229;
  double t226;
  double t225;
  double t223;
  double t222;
  double t221;
  double t220;
  double t219;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t213;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t205;
  double t204;
  double t200;
  double t199;
  double t197;
  double t196;
  double t195;
  double t186;
  double t185;
  double t184;
  double t181;
  double t176;
  double t172;
  double t171;
  double t168;
  double t163;
  double t161;
  double t160;
  double t156;
  double t154;
  double t152;
  double t151;
  double t148;
  double t146;
  double t144;
  double t142;
  double t141;
  double t140;
  double t139;
  double t137;
  double t134;
  double t133;
  double t131;
  double t129;
  double t126;
  double t125;
  double t124;
  double t123;
  double t119;
  double t118;
  double t116;
  double t115;
  double t114;
  double t113;
  double t112;
  double t111;
  double t109;
  double t108;
  double t107;
  double t106;
  double t105;
  double t104;
  double t103;
  double t102;
  double t101;
  double t97;
  double t96;
  double t94;
  double t93;
  double t92;
  double t91;
  double t89;
  double t88;
  double t87;
  double t86;
  double t85;
  double t83;
  double t79;
  double t76;
  double t73;
  double t72;
  double t70;
  double t69;
  double t67;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t57;
  double t54;
  double t51;
  double t48;
  double t47;
  double t45;
  double t44;
  double t42;
  double t41;
  double t38;
  double t37;
  double t36;
  double t35;
  double t34;
  double t31;
  double t29;
  double t27;
  double t26;
  double t24;
  double t23;
  double t22;
  double t21;
  double t20;
  double t19;
  double t17;
  double t16;
  double t15;
  double t14;
  double t12;
  double t11;
  double t10;
  double t9;
  double t8;
  double t7;
  double t6;
  double t5;
  double t4;
  double local_678;
  double local_668;
  double local_660;
  double local_650;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  bool local_609;
  
  pdVar1 = (double *)in_RDI[0x2f];
  dVar4 = (double)(1.0 <= (double)in_RDI[0x31]);
  local_609 = *in_RDX / 2.0 <= (double)in_RDI[0x30] || dVar4 != 0.0;
  dVar5 = (double)local_609;
  dVar6 = cbrt(0.3183098861837907);
  dVar7 = dVar6 * 1.4422495703074083;
  dVar8 = (double)(2.0 <= (double)in_RDI[0x31]);
  local_650 = cbrt((double)in_RDI[0x31]);
  local_678 = local_650 * (double)in_RDI[0x31];
  local_618 = local_678;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_618 = 2.5198420997897464;
  }
  dVar9 = cbrt(*in_RDX);
  dVar10 = cbrt(9.0);
  dVar11 = 1.0 / dVar9;
  local_620 = local_650;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_620 = 1.2599210498948732;
  }
  local_630 = (dVar10 * dVar10 * dVar6 * dVar6 * (double)in_RDI[4] * 1.4422495703074083 * dVar11 *
              (1.2599210498948732 / local_620)) / 18.0;
  bVar2 = 1.35 <= local_630;
  dVar8 = (double)(1.35 < local_630);
  local_628 = local_630;
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    local_628 = 1.35;
  }
  local_628 = local_628 * local_628;
  dVar10 = local_628 * local_628;
  dVar12 = dVar10 * dVar10;
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    local_630 = 1.35;
  }
  dVar8 = sqrt(3.141592653589793);
  dVar13 = erf((1.0 / local_630) / 2.0);
  dVar14 = exp(-(1.0 / (local_630 * local_630)) / 4.0);
  if (((double)bVar2 != 0.0) || (NAN((double)bVar2))) {
    local_638 = (((((((1.0 / local_628) / 36.0 - (1.0 / dVar10) / 960.0) +
                    (1.0 / (dVar10 * local_628)) / 26880.0) - (1.0 / dVar12) / 829440.0) +
                  ((1.0 / dVar12) / local_628) / 28385280.0) -
                 ((1.0 / dVar12) / dVar10) / 1073479680.0) +
                ((1.0 / dVar12) / (dVar10 * local_628)) / 44590694400.0) -
                (1.0 / (dVar12 * dVar12)) / 2021444812800.0;
  }
  else {
    local_638 = -(local_630 * 2.6666666666666665) *
                (local_630 * 2.0 *
                 (-(local_630 * local_630 * 2.0) * (dVar14 - 1.0) + (dVar14 - 1.5)) + dVar8 * dVar13
                ) + 1.0;
  }
  dVar8 = pdVar1[1];
  dVar10 = *in_RCX;
  dVar13 = *in_RDX * *in_RDX;
  dVar14 = dVar9 * dVar9;
  dVar15 = (1.0 / dVar14) / dVar13;
  dVar16 = dVar15 * 1.5874010519681996;
  dVar15 = *in_RCX * 1.5874010519681996 * dVar15;
  dVar12 = pdVar1[2];
  dVar17 = cbrt(9.869604401089358);
  dVar17 = dVar17 * dVar17 * 3.3019272488946267;
  dVar18 = dVar17 * 0.3;
  dVar19 = *in_R9 * 1.5874010519681996 * ((1.0 / dVar14) / *in_RDX);
  dVar20 = dVar18 - dVar19;
  dVar18 = dVar18 + dVar19;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_640 = 0.0;
  }
  else {
    local_640 = dVar7 * 2.519842099789747 * 1.2599210498948732 * -0.046875 * local_618 * dVar9 *
                local_638 *
                (dVar12 * dVar20 * (1.0 / dVar18) +
                dVar8 * dVar10 * 0.003840616724010807 * dVar16 *
                (1.0 / (dVar15 * 0.003840616724010807 + 1.0)) + *pdVar1);
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_648 = (double)in_RDI[0x31];
  }
  else {
    local_648 = 1.0;
  }
  if ((dVar4 != 0.0) || (NAN(dVar4))) {
    local_650 = 1.0 / local_650;
  }
  else {
    local_650 = 1.0;
  }
  dVar8 = dVar7 * 2.519842099789747 * dVar11 * 1.2599210498948732 * local_650;
  dVar10 = sqrt(dVar8);
  dVar12 = sqrt(dVar8);
  dVar12 = dVar8 * dVar12;
  dVar6 = dVar6 * dVar6 * 2.080083823051904;
  dVar21 = dVar6 * 1.5874010519681996 * (1.0 / dVar14) * 1.5874010519681996 * local_650 * local_650;
  dVar22 = log(16.081979498692537 /
               (dVar21 * 0.123235 + dVar12 * 0.204775 + dVar10 * 3.79785 + dVar8 * 0.8969) + 1.0);
  dVar22 = (dVar8 * 0.053425 + 1.0) * 0.0621814 * dVar22;
  local_660 = local_678;
  if ((double)in_RDI[0x31] < 0.0) {
    local_660 = 0.0;
  }
  dVar23 = ((local_618 + local_660) - 2.0) * 1.9236610509315362;
  dVar24 = log(32.16395899738507 /
               (dVar21 * 0.1562925 + dVar12 * 0.420775 + dVar10 * 7.05945 + dVar8 * 1.549425) + 1.0)
  ;
  dVar10 = log(29.608749977793437 /
               (dVar21 * 0.1241775 + dVar12 * 0.1100325 + dVar10 * 5.1785 + dVar8 * 0.905775) + 1.0)
  ;
  dVar10 = (dVar8 * 0.0278125 + 1.0) * dVar10;
  if ((dVar5 != 0.0) || (NAN(dVar5))) {
    local_668 = 0.0;
  }
  else {
    local_668 = (local_648 *
                (dVar23 * 0.0197516734986138 * dVar10 +
                dVar23 * (dVar10 * -0.0197516734986138 +
                         (dVar8 * 0.05137 + 1.0) * -0.0310907 * dVar24 + dVar22) + -dVar22)) / 2.0;
  }
  dVar5 = pdVar1[3];
  dVar8 = *in_RCX;
  dVar23 = dVar15 * 0.46914023462026644 + 1.0;
  dVar10 = pdVar1[4];
  dVar12 = pdVar1[5];
  dVar24 = dVar20 * dVar20;
  dVar25 = dVar18 * dVar18;
  dVar21 = pdVar1[6];
  dVar26 = *in_RCX * *in_RCX;
  dVar26 = dVar26 * dVar26 * dVar26;
  dVar22 = dVar13 * dVar13 * dVar13 * dVar13;
  dVar27 = 1.0 / (dVar22 * dVar22);
  dVar28 = dVar23 * dVar23;
  dVar28 = (1.0 / (dVar28 * dVar28)) / dVar28;
  dVar22 = pdVar1[7];
  dVar11 = dVar7 * 2.519842099789747 * dVar11;
  dVar7 = sqrt(dVar11);
  dVar29 = sqrt(dVar11);
  dVar6 = dVar6 * 1.5874010519681996 * (1.0 / dVar14);
  dVar14 = log(16.081979498692537 /
               (dVar6 * 0.123235 + dVar11 * dVar29 * 0.204775 + dVar7 * 3.79785 + dVar11 * 0.8969) +
               1.0);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    local_678 = 1.0;
  }
  dVar29 = log(29.608749977793437 /
               (dVar6 * 0.1241775 + dVar11 * dVar29 * 0.1100325 + dVar7 * 5.1785 + dVar11 * 0.905775
               ) + 1.0);
  dVar4 = pdVar1[9];
  dVar19 = dVar17 * 0.6 * dVar19;
  dVar6 = *in_R9 * *in_R9 * 1.2599210498948732 * 4.0 * ((1.0 / dVar9) / (dVar13 * *in_RDX));
  dVar9 = dVar19 - dVar6;
  dVar9 = dVar9 * dVar9;
  dVar19 = dVar19 + dVar6;
  dVar19 = dVar19 * dVar19;
  dVar6 = pdVar1[10];
  dVar13 = dVar9 * dVar9 * dVar9;
  dVar17 = (1.0 / (dVar19 * dVar19)) / dVar19;
  dVar7 = pdVar1[0xb];
  dVar15 = cbrt(dVar15);
  if ((*in_stack_00000008 != 0) && ((*(uint *)(*in_RDI + 0x40) & 1) != 0)) {
    lVar3 = in_RSI * (int)in_RDI[0xb];
    *(double *)(*in_stack_00000008 + lVar3 * 8) =
         local_640 * 2.0 +
         local_668 * 2.0 *
         (dVar22 * dVar24 * dVar24 * (1.0 / (dVar25 * dVar25)) * 0.17058312527037534 * dVar26 *
          dVar27 * dVar28 +
         dVar21 * dVar26 * 0.17058312527037534 * dVar27 * dVar28 +
         dVar12 * dVar24 * (1.0 / dVar25) +
         dVar5 * dVar8 * 0.46914023462026644 * dVar16 * (1.0 / dVar23) +
         dVar10 * dVar20 * (1.0 / dVar18)) +
         (((dVar11 * 0.053425 + 1.0) * -0.0621814 * dVar14 +
          (local_678 + local_678 + -2.0) * 1.9236610509315362 * 0.0197516734986138 *
          (dVar11 * 0.0278125 + 1.0) * dVar29) - (local_668 + local_668)) *
         (pdVar1[0xc] * dVar9 * (1.0 / dVar19) * dVar15 +
          dVar7 * dVar13 * dVar17 * dVar15 +
          dVar4 * dVar9 * (1.0 / dVar19) + dVar6 * dVar13 * dVar17 + pdVar1[8]) +
         *(double *)(*in_stack_00000008 + lVar3 * 8);
  }
  return;
}

Assistant:

GPU_DEVICE_FUNCTION static inline void
func_exc_unpol(const xc_func_type *p, size_t ip, const double *rho, const double *sigma, xc_gga_out_params *out)
{
  double t1, t2, t3, t4, t5, t6, t7, t8;
  double t9, t10, t12, t13, t16, t18, t19, t20;
  double t21, t22, t24, t26, t29, t30, t32, t33;
  double t34, t35, t36, t39, t42, t43, t45, t50;
  double t53, t54, t55, t57, t59, t60, t61, t64;
  double t67, t68, t69, t72, t75, t77, t78, t79;
  double t82, t83, t84, t86, t87, t89, t92, t94;
  double t95, t96, t98, t100, t101, t102, t103, t104;
  double t105, t106, t107, t111, t113, t114, t115, t116;
  double t117, t118, t119, t121, t123, t124, t125, t126;
  double t128, t129, t131, t132, t133, t134, t135, t136;
  double t137, t138, t141, t142, t143, t144, t145, t148;
  double t149, t150, t151, t152, t156, t157, t158, t161;
  double t165, t166, t168, t169, t170, t171, t174, t175;
  double t176, t178, t179, t182, t183, t184, t185, t186;
  double t187, t188, t189, t190, t192, t194, t195, t196;
  double t197, t198, t199, t200, t201, t202, t205, t206;
  double t207, t208, t210, t211, t212, t214, t216, t221;
  double t224, t225, t230, t232, t235, t238, t239, t240;
  double t243, t249, t251, t252, t256, t258, t259, t260;
  double t261, t262, t263, t265, t266, t267, t268, t269;
  double t270, t271, t274, t275, t276, t279, t280, t281;
  double t282, t286, t287, t293, t294, t296, t297, t298;
  double t299, t302, t303, t304, t305, t308, t309, t310;
  double t311, t312, t313, t314, t315, t316, t317, t320;
  double t321, t324, tzk0;


  t1 = M_CBRT3;
  t2 = 0.1e1 / M_PI;
  t3 = POW_1_3(t2);
  t4 = t1 * t3;
  t5 = M_CBRT4;
  t6 = t5 * t5;
  t7 = POW_1_3(rho[0]);
  t8 = 0.1e1 / t7;
  t9 = t6 * t8;
  t10 = t4 * t9;
  t12 = 0.1e1 + 0.53425e-1 * t10;
  t13 = sqrt(t10);
  t16 = POW_3_2(t10);
  t18 = t1 * t1;
  t19 = t3 * t3;
  t20 = t18 * t19;
  t21 = t7 * t7;
  t22 = 0.1e1 / t21;
  t24 = t20 * t5 * t22;
  t26 = 0.379785e1 * t13 + 0.8969e0 * t10 + 0.204775e0 * t16 + 0.123235e0 * t24;
  t29 = 0.1e1 + 0.16081824322151104822e2 / t26;
  t30 = log(t29);
  t32 = 0.62182e-1 * t12 * t30;
  t33 = 0.1e1 <= p->zeta_threshold;
  t34 = POW_1_3(p->zeta_threshold);
  t35 = t34 * p->zeta_threshold;
  t36 = my_piecewise3(t33, t35, 1);
  t39 = M_CBRT2;
  t42 = 0.1e1 / (0.2e1 * t39 - 0.2e1);
  t43 = (0.2e1 * t36 - 0.2e1) * t42;
  t45 = 0.1e1 + 0.278125e-1 * t10;
  t50 = 0.51785e1 * t13 + 0.905775e0 * t10 + 0.1100325e0 * t16 + 0.1241775e0 * t24;
  t53 = 0.1e1 + 0.29608574643216675549e2 / t50;
  t54 = log(t53);
  t55 = t45 * t54;
  t57 = 0.19751789702565206229e-1 * t43 * t55;
  t59 = 0.1e1 / t21 / rho[0];
  t60 = t6 * t59;
  t61 = 0.1e1 / rho[0];
  t64 = 0.107924e1 + 0.3964e-1 * t13 + 0.123825e-1 * t10;
  t67 = 0.1e1 + t13 * t64 / 0.2e1;
  t68 = t67 * t67;
  t69 = 0.1e1 / t68;
  t72 = -t32 + t57;
  t75 = t1 * t3 * t2;
  t77 = 0.1e1 / t7 / rho[0];
  t78 = t6 * t77;
  t79 = t75 * t78;
  t82 = t18 * t19 * t2;
  t83 = t5 * t59;
  t84 = t82 * t83;
  t86 = rho[0] * rho[0];
  t87 = 0.1e1 / t86;
  t89 = M_PI * M_PI;
  t92 = t1 * t3 / t89;
  t94 = 0.1e1 / t7 / t86;
  t95 = t6 * t94;
  t96 = t92 * t95;
  t98 = -0.59778596625315888114e-2 * t61 + 0.1317375e-2 * t79 - 0.23775e-3 * t84 + 0.64744236347453835951e-5 * t87 - 0.540140625e-6 * t96;
  t100 = 0.11713266981940447749e-2 * t61 * t69 - t72 * t98;
  t101 = 0.1e1 / t19;
  t102 = t1 * t101;
  t103 = pow(0.4e1, 0.1e1 / 0.6e1);
  t104 = t102 * t103;
  t105 = t13 * t10;
  t106 = t21 * t105;
  t107 = 0.1e1 / t67;
  t111 = t72 * t72;
  t113 = 0.19711288999999999999e-2 * t104 * t106 * t107 - 0.2e1 * t111;
  t114 = 0.1e1 / t113;
  t115 = t100 * t114;
  t116 = t34 * t34;
  t117 = my_piecewise3(t33, t116, 1);
  t118 = t115 * t117;
  t119 = t60 * t118;
  t121 = 0.1e1 + 0.25e-1 * t10;
  t123 = 0.1e1 + 0.4445e-1 * t10;
  t124 = 0.1e1 / t123;
  t125 = t121 * t124;
  t126 = t125 * sigma[0];
  t128 = 0.1e1 / t21 / t86;
  t129 = t6 * t128;
  t131 = log(t10 / 0.4e1);
  t132 = t129 * t131;
  t133 = t117 * t117;
  t134 = 0.1e1 / t133;
  t135 = sigma[0] * t134;
  t136 = 0.1e1 / t121;
  t137 = t136 * t123;
  t138 = t135 * t137;
  t141 = 0.3e2 + 0.72806316506996704929e-2 * t132 * t138;
  t142 = sigma[0] * t94;
  t143 = t134 * t18;
  t144 = 0.1e1 / t3;
  t145 = t143 * t144;
  t148 = 0.3e2 + t142 * t145 / 0.48e2;
  t149 = 0.1e1 / t148;
  t150 = t141 * t149;
  t151 = t102 * t6;
  t152 = t21 * t100;
  t156 = sqrt(0.4e1);
  t157 = t72 * t156;
  t158 = t105 * t107;
  t161 = t6 * t21;
  t165 = 0.619125e-2 * t157 * t158 - 0.79593333333333333331e-1 * t102 * t161 * t98;
  t166 = t165 * t114;
  t168 = 0.79593333333333333331e-1 * t151 * t152 * t114 - t166 * t72;
  t169 = 0.1e1 / t168;
  t170 = t150 * t169;
  t171 = t126 * t170;
  t174 = -t32 + t57 + 0.10427789137624512459e-2 * t119 * t171;
  t175 = t166 * t117;
  t176 = t175 * t126;
  t178 = t94 * t18 * t144;
  t179 = t178 * t170;
  t182 = t115 * t133;
  t183 = t121 * t121;
  t184 = t123 * t123;
  t185 = 0.1e1 / t184;
  t186 = t183 * t185;
  t187 = sigma[0] * sigma[0];
  t188 = t186 * t187;
  t189 = t182 * t188;
  t190 = t86 * t86;
  t192 = 0.1e1 / t21 / t190;
  t194 = t192 * t1 * t101;
  t195 = t141 * t141;
  t196 = t148 * t148;
  t197 = 0.1e1 / t196;
  t198 = t195 * t197;
  t199 = t168 * t168;
  t200 = 0.1e1 / t199;
  t201 = t198 * t200;
  t202 = t194 * t201;
  t205 = 0.1e1 + 0.13900948042322754167e-2 * t176 * t179 - 0.57970906942607043474e-5 * t189 * t202;
  t206 = 0.1e1 / t205;
  t207 = t174 * t206;
  t208 = 0.2e1 <= p->zeta_threshold;
  t210 = my_piecewise3(t208, t35, 0.2e1 * t39);
  t211 = 0.e0 <= p->zeta_threshold;
  t212 = my_piecewise3(t211, t35, 0);
  t214 = (t210 + t212 - 0.2e1) * t42;
  t216 = 0.1e1 + 0.5137e-1 * t10;
  t221 = 0.705945e1 * t13 + 0.1549425e1 * t10 + 0.420775e0 * t16 + 0.1562925e0 * t24;
  t224 = 0.1e1 + 0.32164683177870697974e2 / t221;
  t225 = log(t224);
  t230 = t214 * (-0.3109e-1 * t216 * t225 + t32 - 0.19751789702565206229e-1 * t55);
  t232 = 0.19751789702565206229e-1 * t214 * t55;
  t235 = 0.149676e1 + 0.89527e-3 * t13 + 0.11799625e-1 * t10;
  t238 = 0.1e1 + t13 * t235 / 0.2e1;
  t239 = t238 * t238;
  t240 = 0.1e1 / t239;
  t243 = -t32 + t230 + t232;
  t249 = -0.77371026992393176896e-2 * t61 + 0.187495875e-2 * t79 - 0.362780625e-3 * t84 + 0.10208501871552144532e-4 * t87 - 0.8659659375e-6 * t96;
  t251 = 0.10636476373080147432e-2 * t61 * t240 - t243 * t249;
  t252 = 0.1e1 / t238;
  t256 = t243 * t243;
  t258 = 0.50765919958333333334e-3 * t104 * t106 * t252 - 0.2e1 * t256;
  t259 = 0.1e1 / t258;
  t260 = t251 * t259;
  t261 = t39 * t39;
  t262 = my_piecewise3(t208, t116, t261);
  t263 = my_piecewise3(t211, t116, 0);
  t265 = t262 / 0.2e1 + t263 / 0.2e1;
  t266 = t260 * t265;
  t267 = t60 * t266;
  t268 = t265 * t265;
  t269 = 0.1e1 / t268;
  t270 = sigma[0] * t269;
  t271 = t270 * t137;
  t274 = 0.3e2 + 0.36401987395106744013e-2 * t132 * t271;
  t275 = t269 * t18;
  t276 = t275 * t144;
  t279 = 0.3e2 + t142 * t276 / 0.48e2;
  t280 = 0.1e1 / t279;
  t281 = t274 * t280;
  t282 = t21 * t251;
  t286 = t243 * t156;
  t287 = t105 * t252;
  t293 = 0.58998125e-2 * t286 * t287 - 0.21511666666666666667e-1 * t102 * t161 * t249;
  t294 = t293 * t259;
  t296 = 0.21511666666666666667e-1 * t151 * t282 * t259 - t294 * t243;
  t297 = 0.1e1 / t296;
  t298 = t281 * t297;
  t299 = t126 * t298;
  t302 = -t32 + t230 + t232 + 0.28183154870449698953e-3 * t267 * t299;
  t303 = t294 * t265;
  t304 = t303 * t126;
  t305 = t178 * t298;
  t308 = t260 * t268;
  t309 = t308 * t188;
  t310 = t274 * t274;
  t311 = t279 * t279;
  t312 = 0.1e1 / t311;
  t313 = t310 * t312;
  t314 = t296 * t296;
  t315 = 0.1e1 / t314;
  t316 = t313 * t315;
  t317 = t194 * t316;
  t320 = 0.1e1 + 0.13900948042322754167e-2 * t304 * t305 - 0.57970906942607043474e-5 * t309 * t317;
  t321 = 0.1e1 / t320;
  t324 = t43 * (t302 * t321 - t207);
  tzk0 = t207 + t324;

  if(out->zk != NULL && (p->info->flags & XC_FLAGS_HAVE_EXC))
    out->zk[ip*p->dim.zk + 0] += tzk0;

}